

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::PickerPrivate::drawItem
          (PickerPrivate *this,QPainter *p,QStyleOption *opt,int offset,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long *plVar6;
  undefined4 in_register_0000000c;
  int iVar7;
  PickerPrivate *this_00;
  int iVar8;
  QColor QVar9;
  QRect tickRect;
  QRect r;
  QModelIndex local_80;
  QRect *local_68;
  undefined8 local_60;
  QString local_58;
  QRect local_40;
  
  local_60 = CONCAT44(in_register_0000000c,offset);
  pQVar1 = index->m;
  local_68 = (QRect *)p;
  if ((pQVar1 == (QAbstractItemModel *)0x0) ||
     (uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index), (uVar5 & 0x20) == 0)) {
    plVar6 = (long *)QPalette::brush((int)opt + 0x28,Dark);
    QVar9 = lighterColor((QColor *)(*plVar6 + 8),0x4b);
    local_80._0_8_ = QVar9._0_8_;
    local_80.i._0_4_ = QVar9.ct._4_4_;
    local_80.i._4_2_ = QVar9.ct._8_2_;
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&this->currentIndex);
    if ((local_80.r != index->r) ||
       (((CONCAT26(local_80.i._6_2_,CONCAT24(local_80.i._4_2_,(int)local_80.i)) != index->i ||
         (local_80.c != index->c)) || (local_80.m != index->m)))) {
      QPalette::brush((int)opt + 0x28,Dark);
    }
  }
  QPainter::setPen((QColor *)p);
  iVar4 = this->itemSideMargin;
  local_40.x1 = *(int *)(opt + 0x10) + iVar4;
  local_40.y1 = (int)local_60;
  iVar8 = local_40.y1 + -1;
  local_40.y2 = this->stringHeight + iVar8;
  local_40.x2 = *(int *)(opt + 0x18) + iVar4 + iVar4 * -2;
  itemText(&local_58,this,index);
  accomodateString((QString *)&local_80,&local_58,&local_40,0x101,opt);
  QPainter::drawText(local_68,(int)&local_40,(QString *)0x101,(QRect *)&local_80);
  if ((QArrayData *)local_80._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_80._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_80._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_80._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_80._0_8_,2,8);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar1 = index->m;
  if ((pQVar1 != (QAbstractItemModel *)0x0) &&
     (uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index), (uVar5 & 0x20) != 0)) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&this->currentIndex);
    if (((local_80.r == index->r) &&
        ((CONCAT26(local_80.i._6_2_,CONCAT24(local_80.i._4_2_,(int)local_80.i)) == index->i &&
         (local_80.c == index->c)))) && (local_80.m == index->m)) {
      iVar4 = this->itemSideMargin;
      iVar7 = *(int *)(opt + 0x10);
      this_00 = (PickerPrivate *)(opt + 0x20);
      iVar2 = QFontMetrics::averageCharWidth();
      iVar3 = QFontMetrics::averageCharWidth();
      iVar7 = ((iVar4 + iVar7) - iVar2) - iVar3 / 2;
      iVar4 = QFontMetrics::averageCharWidth();
      local_80.i._4_4_ = iVar8 + this->stringHeight;
      local_80.c = (int)local_60;
      local_80.r = iVar7;
      local_80.i._0_4_ = iVar4 + -1 + iVar7;
      drawTick(this_00,(QRect *)&local_80,(QPainter *)local_68);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::drawItem( QPainter * p, const QStyleOption & opt, int offset,
	const QModelIndex & index )
{
	if( index.flags() & Qt::ItemIsEnabled )
	{
		if( index != currentIndex )
			p->setPen( opt.palette.color( QPalette::WindowText ) );
		else
			p->setPen( highlightColor );
	}
	else
		p->setPen( lighterColor( opt.palette.color( QPalette::WindowText ), 75 ) );

	const QRect r( opt.rect.x() + itemSideMargin, offset,
		opt.rect.width() - itemSideMargin * 2, stringHeight );

	const int flags = Qt::AlignLeft | Qt::TextSingleLine;

	p->drawText( r, flags,
		makeString( itemText( index ), r, flags, opt ) );

	if( index.flags() & Qt::ItemIsEnabled && index == currentIndex )
	{
		const QRect tickRect( opt.rect.x() + itemSideMargin -
				opt.fontMetrics.averageCharWidth() -
				opt.fontMetrics.averageCharWidth() / 2,
			offset,
			opt.fontMetrics.averageCharWidth(),
			stringHeight );

		drawTick( tickRect, p );
	}
}